

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

void Sle_ManStop(Sle_Man_t *p)

{
  Vec_Bit_t *__ptr;
  int *piVar1;
  Vec_Wec_t *pVVar2;
  void *pvVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  sat_solver_delete(p->pSat);
  __ptr = p->vMask;
  piVar1 = __ptr->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(__ptr);
  pVVar5 = p->vCuts;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar2 = p->vCutFanins;
  iVar4 = pVVar2->nCap;
  pVVar5 = pVVar2->pArray;
  if (iVar4 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_007aa47f;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar5 = pVVar2->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar2->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
LAB_007aa47f:
    free(pVVar5);
  }
  free(pVVar2);
  pVVar2 = p->vFanoutEdges;
  iVar4 = pVVar2->nCap;
  pVVar5 = pVVar2->pArray;
  if (iVar4 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_007aa4da;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar5 = pVVar2->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar2->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
LAB_007aa4da:
    free(pVVar5);
  }
  free(pVVar2);
  pVVar2 = p->vEdgeCuts;
  iVar4 = pVVar2->nCap;
  pVVar5 = pVVar2->pArray;
  if (iVar4 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_007aa53a;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        pVVar5 = pVVar2->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar2->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
  }
  free(pVVar5);
LAB_007aa53a:
  free(pVVar2);
  pVVar5 = p->vObjMap;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vCutFirst;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vEdgeFirst;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vDelayFirst;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vPolars;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  pVVar5 = p->vLits;
  piVar1 = pVVar5->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar5);
  free(p);
  return;
}

Assistant:

void Sle_ManStop( Sle_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_BitFree( p->vMask );
    Vec_IntFree( p->vCuts );
    Vec_WecFree( p->vCutFanins );
    Vec_WecFree( p->vFanoutEdges );
    Vec_WecFree( p->vEdgeCuts );
    Vec_IntFree( p->vObjMap );
    Vec_IntFree( p->vCutFirst );
    Vec_IntFree( p->vEdgeFirst );
    Vec_IntFree( p->vDelayFirst );
    Vec_IntFree( p->vPolars );
    Vec_IntFree( p->vLits );
    ABC_FREE( p );
}